

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_Query_R_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Record_Query_R_PDU::GetAsString_abi_cxx11_(Record_Query_R_PDU *this)

{
  long in_RSI;
  
  GetAsString_abi_cxx11_((KString *)this,(Record_Query_R_PDU *)(in_RSI + -0x48));
  return;
}

Assistant:

KString Record_Query_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Record Query-R PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "\tRequest ID:                "   << m_ui32RqId
       << Reliability_Header::GetAsString()
       << "\tEvent Type:                "   << GetEnumAsStringEventType( m_ui16EvntTyp ) << "\n"
       << "\tTime:                      "   << m_ui32Time     << "\n"
       << "\tNumber Of Record IDs:      "   << m_ui32NumRecs  << "\n";

    vector<KUINT32>::const_iterator citr = m_vui32RecID.begin();
    vector<KUINT32>::const_iterator citrEnd = m_vui32RecID.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << "\t" << *citr << "\n";
    }

    return ss.str();
}